

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterMissing_Test::testBody
          (TEST_MockComparatorCopierTest_customTypeOutputParameterMissing_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  MockCheckedExpectedCall *pMVar3;
  UtestShell *test;
  undefined4 extraout_var;
  SimpleString local_198;
  SimpleString local_188;
  SimpleString local_178;
  SimpleString local_168;
  SimpleString local_158;
  SimpleString local_148;
  SimpleString local_138;
  SimpleString local_128;
  SimpleString local_118;
  undefined1 local_108 [8];
  MockExpectedParameterDidntHappenFailure expectedFailure;
  SimpleString local_90;
  SimpleString local_80;
  undefined1 local_70 [8];
  MockExpectedCallsListForTest expectations;
  SimpleString local_50;
  MyTypeForTestingCopier local_40;
  MyTypeForTestingCopier copier;
  undefined1 local_28 [8];
  MyTypeForTesting expectedObject;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockComparatorCopierTest_customTypeOutputParameterMissing_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)((long)&expectedObject.value + 7));
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)local_28,0x1e248);
  MyTypeForTestingCopier::MyTypeForTestingCopier(&local_40);
  SimpleString::SimpleString(&local_50,"");
  pMVar2 = mock(&local_50,(MockFailureReporter *)0x0);
  SimpleString::SimpleString
            ((SimpleString *)&expectations.super_MockExpectedCallsList.head_,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])
            (pMVar2,&expectations.super_MockExpectedCallsList.head_,&local_40);
  SimpleString::~SimpleString((SimpleString *)&expectations.super_MockExpectedCallsList.head_);
  SimpleString::~SimpleString(&local_50);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_70);
  SimpleString::SimpleString(&local_80,"foo");
  pMVar3 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)local_70,&local_80);
  SimpleString::SimpleString(&local_90,"MyTypeForTesting");
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,"output");
  (*(pMVar3->super_MockExpectedCall)._vptr_MockExpectedCall[7])
            (pMVar3,&local_90,
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,local_28);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_118,"foo");
  MockExpectedParameterDidntHappenFailure::MockExpectedParameterDidntHappenFailure
            ((MockExpectedParameterDidntHappenFailure *)local_108,test,&local_118,
             (MockExpectedCallsList *)local_70,(MockExpectedCallsList *)local_70);
  SimpleString::~SimpleString(&local_118);
  SimpleString::SimpleString(&local_128,"");
  pMVar2 = mock(&local_128,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_138,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_138);
  SimpleString::SimpleString(&local_148,"MyTypeForTesting");
  SimpleString::SimpleString(&local_158,"output");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_148,&local_158,local_28);
  SimpleString::~SimpleString(&local_158);
  SimpleString::~SimpleString(&local_148);
  SimpleString::~SimpleString(&local_138);
  SimpleString::~SimpleString(&local_128);
  SimpleString::SimpleString(&local_168,"");
  pMVar2 = mock(&local_168,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_178,"foo");
  (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_178);
  SimpleString::~SimpleString(&local_178);
  SimpleString::~SimpleString(&local_168);
  SimpleString::SimpleString(&local_188,"");
  pMVar2 = mock(&local_188,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_188);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0xee);
  SimpleString::SimpleString(&local_198,"");
  pMVar2 = mock(&local_198,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])();
  SimpleString::~SimpleString(&local_198);
  MockExpectedParameterDidntHappenFailure::~MockExpectedParameterDidntHappenFailure
            ((MockExpectedParameterDidntHappenFailure *)local_108);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_70);
  MyTypeForTestingCopier::~MyTypeForTestingCopier(&local_40);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)((long)&expectedObject.value + 7));
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterMissing)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting expectedObject(123464);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    mock().actualCall("foo");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    mock().removeAllComparatorsAndCopiers();
}